

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void get_rgb_color(RK_U32 *R,RK_U32 *G,RK_U32 *B,RK_S32 x,RK_S32 y,RK_S32 frm_cnt)

{
  int iVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  uint uVar5;
  RK_U32 RVar6;
  int iVar7;
  
  if (frm_cnt == 2) {
    *R = 0;
    *G = 0;
    RVar2 = 0xff;
  }
  else {
    if (frm_cnt == 1) {
      *R = 0;
      *G = 0xff;
    }
    else {
      if (frm_cnt != 0) {
        uVar5 = frm_cnt * 3 + y + x & 0xff;
        iVar1 = (frm_cnt * 5 + x / 2 + 0x40U & 0xff) - 0x80;
        RVar3 = (iVar1 * 0x168 >> 8) + uVar5;
        iVar7 = ((y / 2 ^ 0x80U) + frm_cnt * 2 & 0xff) - 0x80;
        RVar2 = (iVar7 * 0x1c7 >> 8) + uVar5;
        RVar6 = uVar5 - (iVar1 * 0xb8 + iVar7 * 0x58 >> 8);
        if (0xfe < (int)RVar3) {
          RVar3 = 0xff;
        }
        RVar4 = 0;
        if ((int)RVar3 < 1) {
          RVar3 = RVar4;
        }
        if (0xfe < (int)RVar6) {
          RVar6 = 0xff;
        }
        if ((int)RVar6 < 1) {
          RVar6 = RVar4;
        }
        *R = RVar3;
        if (0xfe < (int)RVar2) {
          RVar2 = 0xff;
        }
        *G = RVar6;
        if ((int)RVar2 < 1) {
          RVar2 = RVar4;
        }
        goto LAB_0010e871;
      }
      *R = 0xff;
      *G = 0;
    }
    RVar2 = 0;
  }
LAB_0010e871:
  *B = RVar2;
  return;
}

Assistant:

static void get_rgb_color(RK_U32 *R, RK_U32 *G, RK_U32 *B, RK_S32 x, RK_S32 y, RK_S32 frm_cnt)
{
    // frame 0 -> red
    if (frm_cnt == 0) {
        R[0] = 0xff;
        G[0] = 0;
        B[0] = 0;
        return ;
    }

    // frame 1 -> green
    if (frm_cnt == 1) {
        R[0] = 0;
        G[0] = 0xff;
        B[0] = 0;
        return ;
    }

    // frame 2 -> blue
    if (frm_cnt == 2) {
        R[0] = 0;
        G[0] = 0;
        B[0] = 0xff;
        return ;
    }

    // moving color bar
    RK_U8 Y = (0   +  x + y  + frm_cnt * 3);
    RK_U8 U = (128 + (y / 2) + frm_cnt * 2);
    RK_U8 V = (64  + (x / 2) + frm_cnt * 5);

    RK_S32 _R = Y + ((360 * (V - 128)) >> 8);
    RK_S32 _G = Y - (((88 * (U - 128) + 184 * (V - 128))) >> 8);
    RK_S32 _B = Y + ((455 * (U - 128)) >> 8);

    R[0] = MPP_CLIP3(0, 255, _R);
    G[0] = MPP_CLIP3(0, 255, _G);
    B[0] = MPP_CLIP3(0, 255, _B);
}